

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Embed.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeEmbed(ConvertLayerParameters layerParameters)

{
  RepeatedField<float> *pRVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  Rep *pRVar4;
  string *psVar5;
  Rep *pRVar6;
  bool bVar7;
  uint uVar8;
  char cVar9;
  char cVar10;
  int iVar11;
  Type *pTVar12;
  Type *pTVar13;
  EmbedParameter *pEVar14;
  LogMessage *pLVar15;
  undefined8 *puVar16;
  long *plVar17;
  EmbeddingLayerParams *this;
  WeightParams *pWVar18;
  float *pfVar19;
  uint uVar20;
  int **ppiVar21;
  char **ppcVar22;
  size_type *psVar23;
  ulong *puVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  ConvolutionLayerParams *pCVar28;
  uint uVar29;
  long lVar30;
  ulong uVar31;
  char *pcVar32;
  undefined8 uVar33;
  long lVar34;
  uint uVar35;
  int iVar36;
  Type *this_00;
  uint uVar37;
  void **ppvVar38;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  int *in_stack_00000048;
  string __str_3;
  string __str_2;
  string __str_5;
  string __str_7;
  string __str_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string __str;
  undefined1 local_440 [56];
  Type *local_408;
  Type *local_400;
  undefined1 local_3f8 [56];
  ulong *local_3c0;
  long local_3b8;
  ulong local_3b0;
  undefined8 uStack_3a8;
  ulong local_3a0;
  ulong local_398;
  char **local_390;
  long local_388;
  char *local_380;
  long lStack_378;
  ulong *local_370;
  long local_368;
  ulong local_360;
  long lStack_358;
  ulong local_350;
  string local_348;
  Type *local_328;
  string local_320;
  ConvolutionLayerParams *local_300;
  undefined1 local_2f8 [16];
  char *local_2e8;
  _Alloc_hider _Stack_2e0;
  int local_2bc;
  undefined1 local_2b8 [16];
  char *local_2a8 [5];
  undefined1 local_280 [16];
  int *local_270;
  _Alloc_hider _Stack_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  undefined1 local_210 [56];
  undefined1 local_1d8 [16];
  int *local_1c8 [5];
  string local_1a0;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),*in_stack_00000048);
  iVar11 = getLayerIndex(pTVar12,in_stack_00000030);
  pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000010 + 0x70),iVar11);
  local_400 = google::protobuf::internal::RepeatedPtrFieldBase::
              Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (in_stack_00000018,(Type *)0x0);
  if (((pTVar12->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((pTVar12->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_440._0_8_ = local_440 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_440,"Must have 1 input and 1 output","");
    errorInCaffeProto((string *)local_440,(pTVar12->name_).ptr_,(pTVar12->type_).ptr_);
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
    }
  }
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar4 = (pTVar12->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar38 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar38 = (void **)0x0;
  }
  lVar30 = (long)(pTVar12->bottom_).super_RepeatedPtrFieldBase.current_size_;
  local_408 = pTVar12;
  local_328 = pTVar13;
  if (lVar30 != 0) {
    lVar34 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_228,*(value_type **)((long)ppvVar38 + lVar34));
      lVar34 = lVar34 + 8;
    } while (lVar30 * 8 != lVar34);
  }
  pRVar4 = (local_408->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar38 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar38 = (void **)0x0;
  }
  lVar30 = (long)(local_408->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar30 != 0) {
    lVar34 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_248,*(value_type **)((long)ppvVar38 + lVar34));
      lVar34 = lVar34 + 8;
    } while (lVar30 * 8 != lVar34);
  }
  pTVar12 = local_408;
  convertCaffeMetadata
            ((local_408->name_).ptr_,&local_228,&local_248,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             in_stack_00000028);
  pTVar13 = local_328;
  this_00 = local_400;
  pEVar14 = pTVar12->embed_param_;
  if (pEVar14 == (EmbedParameter *)0x0) {
    pEVar14 = (EmbedParameter *)&caffe::_EmbedParameter_default_instance_;
  }
  uVar37 = pEVar14->num_output_;
  uVar27 = (ulong)uVar37;
  uVar31 = (ulong)pEVar14->input_dim_;
  bVar3 = pEVar14->bias_term_;
  local_350 = 0;
  if (1 < (local_328->blobs_).super_RepeatedPtrFieldBase.current_size_) {
    if ((local_328->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_180,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          (&local_180,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_440,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage(&local_180);
    }
    local_350 = (ulong)*(uint *)(*(long *)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) +
                                0x18);
  }
  local_3a0 = uVar31;
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_440._0_8_ = local_440 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_440,"Weight blobs not provided","");
    psVar5 = (local_408->name_).ptr_;
    local_3f8._0_8_ = local_3f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"Embed","");
    errorInCaffeProto((string *)local_440,psVar5,(string *)local_3f8);
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    uVar31 = local_3a0;
    this_00 = local_400;
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
      this_00 = local_400;
    }
  }
  if (((int)local_350 == 0) && (bVar3 != false)) {
    local_440._0_8_ = local_440 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_440,
               "Expected bias parameters when \'bias_term\' flag is set to True.","");
    psVar5 = (local_408->name_).ptr_;
    local_3f8._0_8_ = local_3f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"Embed","");
    errorInCaffeProto((string *)local_440,psVar5,(string *)local_3f8);
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    uVar31 = local_3a0;
    this_00 = local_400;
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
      this_00 = local_400;
    }
  }
  if ((0 < (int)local_350) && (bVar3 == false)) {
    local_440._0_8_ = local_440 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_440,"Found bias parameters even though \'bias_term\' flag is False",
               "");
    psVar5 = (local_408->name_).ptr_;
    local_3f8._0_8_ = local_3f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"Embed","");
    errorInCaffeProto((string *)local_440,psVar5,(string *)local_3f8);
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    uVar31 = local_3a0;
    this_00 = local_400;
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
      this_00 = local_400;
    }
  }
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        (&local_148,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_440,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage(&local_148);
  }
  puVar16 = *(undefined8 **)
             ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar16 == (undefined8 *)0x0) {
    puVar16 = &caffe::_BlobShape_default_instance_;
  }
  if (*(int *)(puVar16 + 3) != 2) {
    local_440._0_8_ = local_440 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_440,"Weight blob dim size is not 2","");
    psVar5 = (local_408->name_).ptr_;
    local_3f8._0_8_ = local_3f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"Embed","");
    errorInCaffeProto((string *)local_440,psVar5,(string *)local_3f8);
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    uVar31 = local_3a0;
    this_00 = local_400;
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
      this_00 = local_400;
    }
  }
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        (&local_110,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_440,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage(&local_110);
  }
  puVar16 = *(undefined8 **)
             ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar16 == (undefined8 *)0x0) {
    puVar16 = &caffe::_BlobShape_default_instance_;
  }
  if (*(int *)(puVar16 + 3) < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_440,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  local_398 = uVar27;
  if (*(ulong *)(puVar16[4] + 0x10) != uVar27) {
    cVar10 = '\x01';
    if (9 < uVar37) {
      uVar29 = uVar37;
      cVar9 = '\x04';
      do {
        cVar10 = cVar9;
        if (uVar29 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_003df416;
        }
        if (uVar29 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_003df416;
        }
        if (uVar29 < 10000) goto LAB_003df416;
        bVar7 = 99999 < uVar29;
        uVar29 = uVar29 / 10000;
        cVar9 = cVar10 + '\x04';
      } while (bVar7);
      cVar10 = cVar10 + '\x01';
    }
LAB_003df416:
    local_1d8._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct((ulong)local_1d8,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8._0_8_,local_1d8._8_4_,uVar37);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)local_1d8,0,(char *)0x0,0x5fe4a9);
    local_280._0_8_ = &local_270;
    ppiVar21 = (int **)(plVar17 + 2);
    if ((int **)*plVar17 == ppiVar21) {
      local_270 = *ppiVar21;
      _Stack_268._M_p = (pointer)plVar17[3];
    }
    else {
      local_270 = *ppiVar21;
      local_280._0_8_ = (int **)*plVar17;
    }
    local_280._8_8_ = plVar17[1];
    *plVar17 = (long)ppiVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append(local_280);
    ppcVar22 = (char **)(plVar17 + 2);
    if ((char **)*plVar17 == ppcVar22) {
      local_2e8 = *ppcVar22;
      _Stack_2e0._M_p = (pointer)plVar17[3];
      local_2f8._0_8_ = &local_2e8;
    }
    else {
      local_2e8 = *ppcVar22;
      local_2f8._0_8_ = (char **)*plVar17;
    }
    local_2f8._8_8_ = plVar17[1];
    *plVar17 = (long)ppcVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_210,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    puVar16 = *(undefined8 **)
               ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
    if (puVar16 == (undefined8 *)0x0) {
      puVar16 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar16 + 3) < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_210,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    uVar31 = *(ulong *)(puVar16[4] + 0x10);
    uVar27 = -uVar31;
    if (0 < (long)uVar31) {
      uVar27 = uVar31;
    }
    uVar37 = 1;
    if (9 < uVar27) {
      uVar25 = uVar27;
      uVar29 = 4;
      do {
        uVar37 = uVar29;
        if (uVar25 < 100) {
          uVar37 = uVar37 - 2;
          goto LAB_003df657;
        }
        if (uVar25 < 1000) {
          uVar37 = uVar37 - 1;
          goto LAB_003df657;
        }
        if (uVar25 < 10000) goto LAB_003df657;
        bVar7 = 99999 < uVar25;
        uVar25 = uVar25 / 10000;
        uVar29 = uVar37 + 4;
      } while (bVar7);
      uVar37 = uVar37 + 1;
    }
LAB_003df657:
    local_2b8._0_8_ = local_2a8;
    std::__cxx11::string::_M_construct((ulong)local_2b8,(char)uVar37 - (char)((long)uVar31 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)(local_2b8._0_8_ - ((long)uVar31 >> 0x3f)),uVar37,uVar27);
    pcVar32 = (char *)0xf;
    if ((char **)local_2f8._0_8_ != &local_2e8) {
      pcVar32 = local_2e8;
    }
    if (pcVar32 < (char *)(local_2b8._8_8_ + local_2f8._8_8_)) {
      pcVar32 = (char *)0xf;
      if ((char **)local_2b8._0_8_ != local_2a8) {
        pcVar32 = local_2a8[0];
      }
      if (pcVar32 < (char *)(local_2b8._8_8_ + local_2f8._8_8_)) goto LAB_003df6e2;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_2b8,0,(char *)0x0,local_2f8._0_8_);
    }
    else {
LAB_003df6e2:
      puVar16 = (undefined8 *)std::__cxx11::string::_M_append(local_2f8,local_2b8._0_8_);
    }
    local_3f8._0_8_ = local_3f8 + 0x10;
    psVar23 = puVar16 + 2;
    if ((size_type *)*puVar16 == psVar23) {
      local_3f8._16_8_ = *psVar23;
      local_3f8._24_8_ = puVar16[3];
    }
    else {
      local_3f8._16_8_ = *psVar23;
      local_3f8._0_8_ = (size_type *)*puVar16;
    }
    local_3f8._8_8_ = puVar16[1];
    *puVar16 = psVar23;
    puVar16[1] = 0;
    *(undefined1 *)psVar23 = 0;
    plVar17 = (long *)std::__cxx11::string::append(local_3f8);
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      local_440._16_8_ = *psVar23;
      local_440._24_4_ = (undefined4)plVar17[3];
      local_440._28_4_ = *(undefined4 *)((long)plVar17 + 0x1c);
      local_440._0_8_ = local_440 + 0x10;
    }
    else {
      local_440._16_8_ = *psVar23;
      local_440._0_8_ = (size_type *)*plVar17;
    }
    local_440._8_8_ = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    psVar5 = (local_408->name_).ptr_;
    local_210._0_8_ = local_210 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"Embed","");
    errorInCaffeProto((string *)local_440,psVar5,(string *)local_210);
    if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
      operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
    }
    uVar31 = local_3a0;
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
    }
    this_00 = local_400;
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    if ((char **)local_2b8._0_8_ != local_2a8) {
      operator_delete((void *)local_2b8._0_8_,(ulong)(local_2a8[0] + 1));
    }
    if ((char **)local_2f8._0_8_ != &local_2e8) {
      operator_delete((void *)local_2f8._0_8_,(ulong)(local_2e8 + 1));
    }
    uVar27 = local_398;
    if ((int **)local_280._0_8_ != &local_270) {
      operator_delete((void *)local_280._0_8_,(long)local_270 + 1);
    }
    if ((int **)local_1d8._0_8_ != local_1c8) {
      operator_delete((void *)local_1d8._0_8_,(long)local_1c8[0] + 1);
    }
  }
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_210,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_210,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_440,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_210);
  }
  puVar16 = *(undefined8 **)
             ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar16 == (undefined8 *)0x0) {
    puVar16 = &caffe::_BlobShape_default_instance_;
  }
  if (*(int *)(puVar16 + 3) < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_2b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_2b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_440,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_2b8);
  }
  if (*(ulong *)(puVar16[4] + 8) != uVar31) {
    cVar10 = '\x01';
    uVar37 = (uint)uVar31;
    if (9 < uVar37) {
      cVar9 = '\x04';
      do {
        cVar10 = cVar9;
        uVar29 = (uint)uVar31;
        if (uVar29 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_003df9fc;
        }
        if (uVar29 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_003df9fc;
        }
        if (uVar29 < 10000) goto LAB_003df9fc;
        uVar31 = (uVar31 & 0xffffffff) / 10000;
        cVar9 = cVar10 + '\x04';
      } while (99999 < uVar29);
      cVar10 = cVar10 + '\x01';
    }
LAB_003df9fc:
    local_370 = &local_360;
    std::__cxx11::string::_M_construct((ulong)&local_370,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_370,(uint)local_368,uVar37);
    puVar16 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_370,0,(char *)0x0,0x5fe4f1);
    local_3c0 = &local_3b0;
    puVar24 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar24) {
      local_3b0 = *puVar24;
      uStack_3a8 = puVar16[3];
    }
    else {
      local_3b0 = *puVar24;
      local_3c0 = (ulong *)*puVar16;
    }
    local_3b8 = puVar16[1];
    *puVar16 = puVar24;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    ppcVar22 = (char **)(plVar17 + 2);
    if ((char **)*plVar17 == ppcVar22) {
      local_2e8 = *ppcVar22;
      _Stack_2e0._M_p = (pointer)plVar17[3];
      local_2f8._0_8_ = &local_2e8;
    }
    else {
      local_2e8 = *ppcVar22;
      local_2f8._0_8_ = (char **)*plVar17;
    }
    local_2f8._8_8_ = plVar17[1];
    *plVar17 = (long)ppcVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_1d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_1d8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_280,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1d8);
    }
    puVar16 = *(undefined8 **)
               ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
    if (puVar16 == (undefined8 *)0x0) {
      puVar16 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar16 + 3) < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_280,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar15 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_280,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_348,pLVar15);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_280);
    }
    uVar31 = *(ulong *)(puVar16[4] + 8);
    uVar27 = -uVar31;
    if (0 < (long)uVar31) {
      uVar27 = uVar31;
    }
    uVar37 = 1;
    if (9 < uVar27) {
      uVar25 = uVar27;
      uVar29 = 4;
      do {
        uVar37 = uVar29;
        if (uVar25 < 100) {
          uVar37 = uVar37 - 2;
          goto LAB_003dfc3b;
        }
        if (uVar25 < 1000) {
          uVar37 = uVar37 - 1;
          goto LAB_003dfc3b;
        }
        if (uVar25 < 10000) goto LAB_003dfc3b;
        bVar7 = 99999 < uVar25;
        uVar25 = uVar25 / 10000;
        uVar29 = uVar37 + 4;
      } while (bVar7);
      uVar37 = uVar37 + 1;
    }
LAB_003dfc3b:
    local_390 = &local_380;
    std::__cxx11::string::_M_construct
              ((ulong)&local_390,(char)uVar37 - (char)((long)uVar31 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_390 - ((long)uVar31 >> 0x3f)),uVar37,uVar27);
    pcVar32 = (char *)0xf;
    if ((char **)local_2f8._0_8_ != &local_2e8) {
      pcVar32 = local_2e8;
    }
    if (pcVar32 < (char *)(local_2f8._8_8_ + local_388)) {
      pcVar32 = (char *)0xf;
      if (local_390 != &local_380) {
        pcVar32 = local_380;
      }
      if (pcVar32 < (char *)(local_2f8._8_8_ + local_388)) goto LAB_003dfcc6;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,local_2f8._0_8_);
    }
    else {
LAB_003dfcc6:
      puVar16 = (undefined8 *)std::__cxx11::string::_M_append(local_2f8,(ulong)local_390);
    }
    local_3f8._0_8_ = local_3f8 + 0x10;
    psVar23 = puVar16 + 2;
    if ((size_type *)*puVar16 == psVar23) {
      local_3f8._16_8_ = *psVar23;
      local_3f8._24_8_ = puVar16[3];
    }
    else {
      local_3f8._16_8_ = *psVar23;
      local_3f8._0_8_ = (size_type *)*puVar16;
    }
    local_3f8._8_8_ = puVar16[1];
    *puVar16 = psVar23;
    puVar16[1] = 0;
    *(undefined1 *)psVar23 = 0;
    plVar17 = (long *)std::__cxx11::string::append(local_3f8);
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      local_440._16_8_ = *psVar23;
      local_440._24_4_ = (undefined4)plVar17[3];
      local_440._28_4_ = *(undefined4 *)((long)plVar17 + 0x1c);
      local_440._0_8_ = local_440 + 0x10;
    }
    else {
      local_440._16_8_ = *psVar23;
      local_440._0_8_ = (size_type *)*plVar17;
    }
    local_440._8_8_ = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    psVar5 = (local_408->name_).ptr_;
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"Embed","");
    errorInCaffeProto((string *)local_440,psVar5,&local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    uVar31 = local_3a0;
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
    }
    this_00 = local_400;
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    if (local_390 != &local_380) {
      operator_delete(local_390,(ulong)(local_380 + 1));
    }
    if ((char **)local_2f8._0_8_ != &local_2e8) {
      operator_delete((void *)local_2f8._0_8_,(ulong)(local_2e8 + 1));
    }
    uVar27 = local_398;
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0,local_3b0 + 1);
    }
    if (local_370 != &local_360) {
      operator_delete(local_370,local_360 + 1);
    }
  }
  if (this_00->_oneof_case_[0] != 0x96) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x96;
    this = (EmbeddingLayerParams *)operator_new(0x38);
    CoreML::Specification::EmbeddingLayerParams::EmbeddingLayerParams(this);
    (local_400->layer_).embedding_ = this;
    this_00 = local_400;
  }
  local_300 = (this_00->layer_).convolution_;
  *(ulong *)&local_300->_kernelsize_cached_byte_size_ = uVar31;
  (local_300->stride_).current_size_ = (int)uVar27;
  (local_300->stride_).total_size_ = (int)(uVar27 >> 0x20);
  *(bool *)&(local_300->stride_).rep_ = bVar3;
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_2f8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_2f8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_440,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_2f8);
  }
  uVar29 = (int)uVar27 * (int)uVar31;
  uVar37 = *(uint *)((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18);
  if (((int)uVar37 < 0) || (uVar37 != uVar29)) {
    cVar10 = '\x01';
    if (9 < uVar29) {
      uVar26 = uVar29;
      cVar9 = '\x04';
      do {
        cVar10 = cVar9;
        if (uVar26 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_003dffe6;
        }
        if (uVar26 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_003dffe6;
        }
        if (uVar26 < 10000) goto LAB_003dffe6;
        bVar7 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        cVar9 = cVar10 + '\x04';
      } while (bVar7);
      cVar10 = cVar10 + '\x01';
    }
LAB_003dffe6:
    local_390 = &local_380;
    std::__cxx11::string::_M_construct((ulong)&local_390,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_390,(uint)local_388,uVar29);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,0x5fe537);
    local_370 = &local_360;
    puVar24 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar24) {
      local_360 = *puVar24;
      lStack_358 = plVar17[3];
    }
    else {
      local_360 = *puVar24;
      local_370 = (ulong *)*plVar17;
    }
    local_368 = plVar17[1];
    *plVar17 = (long)puVar24;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
    puVar24 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar24) {
      local_3b0 = *puVar24;
      uStack_3a8 = puVar16[3];
      local_3c0 = &local_3b0;
    }
    else {
      local_3b0 = *puVar24;
      local_3c0 = (ulong *)*puVar16;
    }
    local_3b8 = puVar16[1];
    *puVar16 = puVar24;
    puVar16[1] = 0;
    *(undefined1 *)(puVar16 + 2) = 0;
    uVar26 = -uVar37;
    if (0 < (int)uVar37) {
      uVar26 = uVar37;
    }
    uVar35 = 1;
    if (9 < uVar26) {
      uVar31 = (ulong)uVar26;
      uVar8 = 4;
      do {
        uVar35 = uVar8;
        uVar20 = (uint)uVar31;
        if (uVar20 < 100) {
          uVar35 = uVar35 - 2;
          goto LAB_003e0141;
        }
        if (uVar20 < 1000) {
          uVar35 = uVar35 - 1;
          goto LAB_003e0141;
        }
        if (uVar20 < 10000) goto LAB_003e0141;
        uVar31 = uVar31 / 10000;
        uVar8 = uVar35 + 4;
      } while (99999 < uVar20);
      uVar35 = uVar35 + 1;
    }
LAB_003e0141:
    paVar2 = &local_348.field_2;
    local_348._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct((ulong)&local_348,(char)uVar35 - (char)((int)uVar37 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_348._M_dataplus._M_p + (uVar37 >> 0x1f),uVar35,uVar26);
    pTVar12 = local_408;
    uVar31 = CONCAT44(local_348._M_string_length._4_4_,(uint)local_348._M_string_length) + local_3b8
    ;
    uVar27 = 0xf;
    if (local_3c0 != &local_3b0) {
      uVar27 = local_3b0;
    }
    if (uVar27 < uVar31) {
      uVar33 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar2) {
        uVar33 = local_348.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar33 < uVar31) goto LAB_003e01d1;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_348,0,(char *)0x0,(ulong)local_3c0);
    }
    else {
LAB_003e01d1:
      puVar16 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_3c0,(ulong)local_348._M_dataplus._M_p);
    }
    local_3f8._0_8_ = local_3f8 + 0x10;
    psVar23 = puVar16 + 2;
    if ((size_type *)*puVar16 == psVar23) {
      local_3f8._16_8_ = *psVar23;
      local_3f8._24_8_ = puVar16[3];
    }
    else {
      local_3f8._16_8_ = *psVar23;
      local_3f8._0_8_ = (size_type *)*puVar16;
    }
    local_3f8._8_8_ = puVar16[1];
    *puVar16 = psVar23;
    puVar16[1] = 0;
    *(undefined1 *)psVar23 = 0;
    plVar17 = (long *)std::__cxx11::string::append(local_3f8);
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      local_440._16_8_ = *psVar23;
      local_440._24_4_ = (undefined4)plVar17[3];
      local_440._28_4_ = *(undefined4 *)((long)plVar17 + 0x1c);
      local_440._0_8_ = local_440 + 0x10;
    }
    else {
      local_440._16_8_ = *psVar23;
      local_440._0_8_ = (size_type *)*plVar17;
    }
    local_440._8_8_ = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    psVar5 = (pTVar12->name_).ptr_;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Inner Product","");
    errorInCaffeProto((string *)local_440,psVar5,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
    }
    if ((undefined1 *)local_3f8._0_8_ != local_3f8 + 0x10) {
      operator_delete((void *)local_3f8._0_8_,local_3f8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    uVar27 = local_398;
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0,local_3b0 + 1);
    }
    uVar31 = local_3a0;
    if (local_370 != &local_360) {
      operator_delete(local_370,local_360 + 1);
    }
    if (local_390 != &local_380) {
      operator_delete(local_390,(ulong)(local_380 + 1));
    }
  }
  pCVar28 = local_300;
  lVar30._0_4_ = (local_300->kernelsize_).current_size_;
  lVar30._4_4_ = (local_300->kernelsize_).total_size_;
  if (lVar30 == 0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    *(WeightParams **)&pCVar28->kernelsize_ = pWVar18;
  }
  if ((int)uVar29 < 0) {
    __assert_fail("blobSize <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                  ,0x5d,
                  "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  lVar30 = *(long *)&pCVar28->kernelsize_;
  pRVar1 = (RepeatedField<float> *)(lVar30 + 0x10);
  if (pRVar1->current_size_ < (int)uVar29) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,uVar29);
    uVar37 = pRVar1->current_size_;
    if (uVar37 != uVar29) {
      memset((void *)(*(long *)(lVar30 + 0x18) + (long)(int)uVar37 * 4 + 8),0,
             (ulong)uVar29 * 4 + (long)(int)uVar37 * -4);
    }
  }
  pRVar1->current_size_ = uVar29;
  if ((int)uVar27 != 0) {
    iVar11 = 0;
    iVar36 = 0;
    do {
      local_400 = (Type *)CONCAT44(local_400._4_4_,iVar11);
      uVar37 = (uint)uVar31;
      uVar27 = uVar31 & 0xffffffff;
      local_2bc = iVar36;
      uVar31 = local_3a0;
      while (local_3a0 = uVar31, uVar37 != 0) {
        if (iVar11 < 0) {
          __assert_fail("index <= INT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                        ,0x62,
                        "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        if (iVar36 < 0) {
          __assert_fail("dataIndex <= INT_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                        ,100,
                        "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                       );
        }
        if ((local_328->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_3f8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar15 = google::protobuf::internal::LogMessage::operator<<
                              ((LogMessage *)local_3f8,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3c0,pLVar15);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_3f8);
        }
        pfVar19 = google::protobuf::RepeatedField<float>::Get
                            ((RepeatedField<float> *)
                             ((long)((local_328->blobs_).super_RepeatedPtrFieldBase.rep_)->elements
                                    [0] + 0x18),iVar36);
        local_440._0_4_ = *pfVar19;
        google::protobuf::RepeatedField<float>::Set(pRVar1,iVar11,(float *)local_440);
        iVar36 = iVar36 + (int)local_398;
        iVar11 = iVar11 + 1;
        uVar37 = (int)uVar27 - 1;
        uVar27 = (ulong)uVar37;
        uVar31 = local_3a0;
      }
      iVar36 = local_2bc + 1;
      iVar11 = (int)local_400 + (int)uVar31;
    } while (iVar36 != (int)local_398);
  }
  if (bVar3 == false) goto LAB_003e0ad2;
  uVar37 = (uint)local_398;
  if (((int)(uint)local_350 < 0) ||
     (pCVar28 = local_300, uVar31 = local_398, pTVar12 = local_328, (uint)local_350 != uVar37)) {
    cVar10 = '\x01';
    if (9 < uVar37) {
      uVar31 = local_398;
      cVar9 = '\x04';
      do {
        cVar10 = cVar9;
        uVar29 = (uint)uVar31;
        if (uVar29 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_003e05bf;
        }
        if (uVar29 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_003e05bf;
        }
        if (uVar29 < 10000) goto LAB_003e05bf;
        uVar31 = (uVar31 & 0xffffffff) / 10000;
        cVar9 = cVar10 + '\x04';
      } while (99999 < uVar29);
      cVar10 = cVar10 + '\x01';
    }
LAB_003e05bf:
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_348,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_348._M_dataplus._M_p,(uint)local_348._M_string_length,uVar37);
    plVar17 = (long *)std::__cxx11::string::replace((ulong)&local_348,0,(char *)0x0,0x5fe537);
    local_390 = &local_380;
    ppcVar22 = (char **)(plVar17 + 2);
    if ((char **)*plVar17 == ppcVar22) {
      local_380 = *ppcVar22;
      lStack_378 = plVar17[3];
    }
    else {
      local_380 = *ppcVar22;
      local_390 = (char **)*plVar17;
    }
    local_388 = plVar17[1];
    *plVar17 = (long)ppcVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_390);
    puVar24 = (ulong *)(plVar17 + 2);
    if ((ulong *)*plVar17 == puVar24) {
      local_360 = *puVar24;
      lStack_358 = plVar17[3];
      local_370 = &local_360;
    }
    else {
      local_360 = *puVar24;
      local_370 = (ulong *)*plVar17;
    }
    local_368 = plVar17[1];
    *plVar17 = (long)puVar24;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    uVar29 = (uint)local_350;
    uVar37 = -uVar29;
    if (0 < (int)uVar29) {
      uVar37 = uVar29;
    }
    uVar29 = 1;
    if (9 < uVar37) {
      uVar31 = (ulong)uVar37;
      uVar26 = 4;
      do {
        uVar29 = uVar26;
        uVar35 = (uint)uVar31;
        if (uVar35 < 100) {
          uVar29 = uVar29 - 2;
          goto LAB_003e0725;
        }
        if (uVar35 < 1000) {
          uVar29 = uVar29 - 1;
          goto LAB_003e0725;
        }
        if (uVar35 < 10000) goto LAB_003e0725;
        uVar31 = uVar31 / 10000;
        uVar26 = uVar29 + 4;
      } while (99999 < uVar35);
      uVar29 = uVar29 + 1;
    }
LAB_003e0725:
    uVar31 = local_350 >> 0x1f;
    paVar2 = &local_320.field_2;
    local_320._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_320,(char)uVar29 - ((char)(local_350 >> 0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_320._M_dataplus._M_p + (uVar31 & 1),uVar29,uVar37);
    uVar31 = 0xf;
    if (local_370 != &local_360) {
      uVar31 = local_360;
    }
    if (uVar31 < local_320._M_string_length + local_368) {
      uVar33 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != paVar2) {
        uVar33 = local_320.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar33 < local_320._M_string_length + local_368) goto LAB_003e07b7;
      puVar16 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,(ulong)local_370);
    }
    else {
LAB_003e07b7:
      puVar16 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_370,(ulong)local_320._M_dataplus._M_p);
    }
    local_3c0 = &local_3b0;
    puVar24 = puVar16 + 2;
    if ((ulong *)*puVar16 == puVar24) {
      local_3b0 = *puVar24;
      uStack_3a8 = puVar16[3];
    }
    else {
      local_3b0 = *puVar24;
      local_3c0 = (ulong *)*puVar16;
    }
    local_3b8 = puVar16[1];
    *puVar16 = puVar24;
    puVar16[1] = 0;
    *(undefined1 *)puVar24 = 0;
    plVar17 = (long *)std::__cxx11::string::append((char *)&local_3c0);
    psVar23 = (size_type *)(plVar17 + 2);
    if ((size_type *)*plVar17 == psVar23) {
      local_440._16_8_ = *psVar23;
      local_440._24_4_ = (undefined4)plVar17[3];
      local_440._28_4_ = *(undefined4 *)((long)plVar17 + 0x1c);
      local_440._0_8_ = local_440 + 0x10;
    }
    else {
      local_440._16_8_ = *psVar23;
      local_440._0_8_ = (size_type *)*plVar17;
    }
    local_440._8_8_ = plVar17[1];
    *plVar17 = (long)psVar23;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    psVar5 = (local_408->name_).ptr_;
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"Inner Product","");
    errorInCaffeProto((string *)local_440,psVar5,&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_440._0_8_ != local_440 + 0x10) {
      operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
    }
    if (local_3c0 != &local_3b0) {
      operator_delete(local_3c0,local_3b0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if (local_370 != &local_360) {
      operator_delete(local_370,local_360 + 1);
    }
    pCVar28 = local_300;
    pTVar12 = local_328;
    if (local_390 != &local_380) {
      operator_delete(local_390,(ulong)(local_380 + 1));
    }
    uVar31 = local_398;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
  }
  if ((pCVar28->kernelsize_).rep_ == (Rep *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    (pCVar28->kernelsize_).rep_ = (Rep *)pWVar18;
  }
  iVar11 = (int)uVar31;
  if (iVar11 < 0) {
    __assert_fail("outputChannels <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Embed.cpp"
                  ,0x71,
                  "void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pRVar6 = (pCVar28->kernelsize_).rep_;
  pRVar1 = (RepeatedField<float> *)(pRVar6 + 1);
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar36 = pRVar1->current_size_;
    if (iVar36 != iVar11) {
      memset((void *)(pRVar6[1].elements[0] + (long)iVar36 * 4 + 8),0,uVar31 * 4 + (long)iVar36 * -4
            );
    }
  }
  pRVar1->current_size_ = iVar11;
  if ((pTVar12->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_440,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar15 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_440,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_3c0,pLVar15);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_440);
  }
  lVar30 = *(long *)((pTVar12->blobs_).super_RepeatedPtrFieldBase.rep_ + 1);
  if ((RepeatedField<float> *)(lVar30 + 0x18) != pRVar1) {
    pRVar1->current_size_ = 0;
    iVar11 = ((RepeatedField<float> *)(lVar30 + 0x18))->current_size_;
    if (iVar11 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
      memcpy((void *)(pRVar6[1].elements[0] + (long)*(int *)&pRVar6[1].arena * 4 + 8),
             (void *)(*(long *)(lVar30 + 0x20) + 8),(long)*(int *)(lVar30 + 0x18) << 2);
      *(int *)&pRVar6[1].arena = *(int *)&pRVar6[1].arena + *(int *)(lVar30 + 0x18);
    }
  }
LAB_003e0ad2:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeEmbed(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
   
    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::EmbedParameter& caffeLayerParams = caffeLayer.embed_param();
    
    uint32_t inputChannels = caffeLayerParams.input_dim();
    uint32_t outputChannels = caffeLayerParams.num_output();
    bool hasBias = caffeLayerParams.bias_term();
    int caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto("Weight blobs not provided", caffeLayer.name(), "Embed");
    }
    if (hasBias && caffeBiasLength == 0){
        CoreMLConverter::errorInCaffeProto("Expected bias parameters when 'bias_term' flag is set to True.", caffeLayer.name(), "Embed");
    }
    if (!hasBias && caffeBiasLength > 0) {
        CoreMLConverter::errorInCaffeProto("Found bias parameters even though 'bias_term' flag is False", caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim_size() != 2){
        CoreMLConverter::errorInCaffeProto("Weight blob dim size is not 2", caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim(1) != outputChannels){
        CoreMLConverter::errorInCaffeProto("num_output("+std::to_string(outputChannels)+") does not match the second dimension of the weight matrix("+std::to_string(caffeLayerWeights.blobs(0).shape().dim(1))+")"
                                          ,caffeLayer.name(), "Embed");
    }
    if (caffeLayerWeights.blobs(0).shape().dim(0) != inputChannels){
        CoreMLConverter::errorInCaffeProto("input_dim("+std::to_string(inputChannels)+") does not match the first dimension of the weight matrix("+std::to_string(caffeLayerWeights.blobs(0).shape().dim(0))+")"
                                          ,caffeLayer.name(), "Embed");
    }
    //**************************************************************
    
    Specification::EmbeddingLayerParams* specLayerParams = specLayer->mutable_embedding();
    specLayerParams->set_inputdim(inputChannels);
    specLayerParams->set_outputchannels(outputChannels);
    specLayerParams->set_hasbias(hasBias);
    
    // Write weights: need to transpose
    // Caffe embed weights are stored as [inputChannels,outputChannels]
    // CoreML needs in the format: [outputChannels,inputChannels]
    uint32_t blobSize = inputChannels*outputChannels;
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSizeWeights < 0 ||
        static_cast<uint32_t>(caffeBlobSizeWeights) != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string(caffeBlobSizeWeights)+" in caffe"
                                          , caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* weightsWrite = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weightsWrite->Resize(static_cast<int>(blobSize), 0.0);
    for (uint32_t r=0; r<outputChannels; r++){
        for (uint32_t c=0; c<inputChannels; c++){
            uint32_t index = r*inputChannels+c;
            assert(index <= INT_MAX);
            uint32_t dataIndex = c*outputChannels+r;
            assert(dataIndex <= INT_MAX);
            weightsWrite->Set(static_cast<int>(index), caffeLayerWeights.blobs(0).data(static_cast<int>(dataIndex)));
        }
    }
    
    // Write bias
    if (hasBias) {
        if (caffeBiasLength < 0 ||
            static_cast<uint32_t>(caffeBiasLength) != outputChannels) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                                              , caffeLayer.name(), "Inner Product");
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        biasWrite->Resize(static_cast<int>(outputChannels), 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
    }

}